

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int nghttp2_session_create_idle_stream
              (nghttp2_session *session,int32_t stream_id,nghttp2_priority_spec *pri_spec)

{
  int iVar1;
  void *pvVar2;
  nghttp2_stream *pnVar3;
  int iVar4;
  nghttp2_priority_spec pri_spec_copy;
  nghttp2_priority_spec local_30;
  
  iVar4 = 0;
  if (((session->pending_no_rfc7540_priorities != '\x01') && (iVar4 = -0x1f5, stream_id != 0)) &&
     (pri_spec->stream_id != stream_id)) {
    if ((session->server == '\0') == (bool)((byte)stream_id & 1)) {
      iVar1 = session->last_sent_stream_id;
    }
    else {
      iVar1 = session->last_recv_stream_id;
    }
    if ((iVar1 < stream_id) &&
       (pvVar2 = nghttp2_map_find(&session->streams,stream_id), pvVar2 == (void *)0x0)) {
      local_30.exclusive = pri_spec->exclusive;
      local_30._9_3_ = *(undefined3 *)&pri_spec->field_0x9;
      local_30.stream_id = pri_spec->stream_id;
      local_30.weight = pri_spec->weight;
      nghttp2_priority_spec_normalize_weight(&local_30);
      pnVar3 = nghttp2_session_open_stream
                         (session,stream_id,'\0',&local_30,NGHTTP2_STREAM_IDLE,(void *)0x0);
      iVar4 = -0x385;
      if (pnVar3 != (nghttp2_stream *)0x0) {
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int nghttp2_session_create_idle_stream(nghttp2_session *session,
                                       int32_t stream_id,
                                       const nghttp2_priority_spec *pri_spec) {
  nghttp2_stream *stream;
  nghttp2_priority_spec pri_spec_copy;

  if (session->pending_no_rfc7540_priorities == 1) {
    return 0;
  }

  if (stream_id == 0 || stream_id == pri_spec->stream_id ||
      !session_detect_idle_stream(session, stream_id)) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  stream = nghttp2_session_get_stream_raw(session, stream_id);
  if (stream) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  pri_spec_copy = *pri_spec;
  nghttp2_priority_spec_normalize_weight(&pri_spec_copy);

  stream =
    nghttp2_session_open_stream(session, stream_id, NGHTTP2_STREAM_FLAG_NONE,
                                &pri_spec_copy, NGHTTP2_STREAM_IDLE, NULL);
  if (!stream) {
    return NGHTTP2_ERR_NOMEM;
  }

  /* We don't intentionally call nghttp2_session_adjust_idle_stream()
     so that idle stream created by this function, and existing ones
     are kept for application.  We will adjust number of idle stream
     in nghttp2_session_mem_send2 or nghttp2_session_mem_recv2 is
     called. */
  return 0;
}